

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_singleton.c
# Opt level: O0

int configuration_singleton_clear(configuration config)

{
  set_value pvVar1;
  configuration in_RDI;
  set_key unaff_retaddr;
  set in_stack_00000008;
  configuration_singleton singleton;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  configuration_singleton_instance();
  configuration_object_name(in_RDI);
  pvVar1 = set_get((set)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (pvVar1 == (set_value)0x0) {
    iVar2 = 0;
  }
  else {
    configuration_object_name(in_RDI);
    pvVar1 = set_remove(in_stack_00000008,unaff_retaddr);
    if (pvVar1 == (set_value)0x0) {
      iVar2 = 1;
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int configuration_singleton_clear(configuration config)
{
	configuration_singleton singleton = configuration_singleton_instance();

	if (set_get(singleton->scopes, (const set_key)configuration_object_name(config)) == NULL)
	{
		return 0;
	}

	if (set_remove(singleton->scopes, (const set_key)configuration_object_name(config)) == NULL)
	{
		return 1;
	}

	return 0;
}